

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O1

void __thiscall wasm::LazyLocalGraph::makeFlower(LazyLocalGraph *this)

{
  undefined1 *puVar1;
  LocalGraphFlower *this_00;
  pointer __p;
  __uniq_ptr_impl<wasm::LocalGraphFlower,_std::default_delete<wasm::LocalGraphFlower>_> local_30;
  
  if ((this->locations).
      super__Optional_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>_>
      ._M_engaged != true) {
    puVar1 = (undefined1 *)
             ((long)&(this->locations).
                     super__Optional_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>_>
                     ._M_payload + 8);
    *(undefined8 *)
     ((long)&(this->locations).
             super__Optional_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>_>
             ._M_payload + 0x10) = 0;
    *(undefined8 *)
     ((long)&(this->locations).
             super__Optional_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>_>
             ._M_payload + 0x18) = 0;
    *(undefined8 *)
     ((long)&(this->locations).
             super__Optional_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>_>
             ._M_payload + 0x20) = 0;
    *(undefined8 *)
     ((long)&(this->locations).
             super__Optional_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>_>
             ._M_payload + 0x28) = 0;
    *(undefined8 *)
     &(this->locations).
      super__Optional_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>_>
      ._M_payload = 0;
    *(undefined8 *)
     ((long)&(this->locations).
             super__Optional_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>_>
             ._M_payload + 8) = 0;
    *(undefined1 **)
     ((long)&(this->locations).
             super__Optional_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>_>
             ._M_payload + 0x18) = puVar1;
    *(undefined1 **)
     ((long)&(this->locations).
             super__Optional_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>_>
             ._M_payload + 0x20) = puVar1;
    *(undefined8 *)
     ((long)&(this->locations).
             super__Optional_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>_>
             ._M_payload + 0x28) = 0;
    (this->locations).
    super__Optional_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>_>
    ._M_engaged = true;
    this_00 = (LocalGraphFlower *)operator_new(0x340);
    LocalGraphFlower::LocalGraphFlower
              (this_00,&this->getSetsMap,(Locations *)&this->locations,
               (this->super_LocalGraphBase).func,(this->super_LocalGraphBase).module,
               (_Optional_base<wasm::Expression::Id,_true,_true>)
               SUB42(*(undefined4 *)&this->queryClass,0));
    local_30._M_t.
    super__Tuple_impl<0UL,_wasm::LocalGraphFlower_*,_std::default_delete<wasm::LocalGraphFlower>_>.
    super__Head_base<0UL,_wasm::LocalGraphFlower_*,_false>._M_head_impl =
         (tuple<wasm::LocalGraphFlower_*,_std::default_delete<wasm::LocalGraphFlower>_>)
         (_Tuple_impl<0UL,_wasm::LocalGraphFlower_*,_std::default_delete<wasm::LocalGraphFlower>_>)
         0x0;
    std::__uniq_ptr_impl<wasm::LocalGraphFlower,_std::default_delete<wasm::LocalGraphFlower>_>::
    reset((__uniq_ptr_impl<wasm::LocalGraphFlower,_std::default_delete<wasm::LocalGraphFlower>_> *)
          &this->flower,this_00);
    std::unique_ptr<wasm::LocalGraphFlower,_std::default_delete<wasm::LocalGraphFlower>_>::
    ~unique_ptr((unique_ptr<wasm::LocalGraphFlower,_std::default_delete<wasm::LocalGraphFlower>_> *)
                &local_30);
    LocalGraphFlower::prepareLaziness
              ((this->flower)._M_t.
               super___uniq_ptr_impl<wasm::LocalGraphFlower,_std::default_delete<wasm::LocalGraphFlower>_>
               ._M_t.
               super__Tuple_impl<0UL,_wasm::LocalGraphFlower_*,_std::default_delete<wasm::LocalGraphFlower>_>
               .super__Head_base<0UL,_wasm::LocalGraphFlower_*,_false>._M_head_impl);
    return;
  }
  __assert_fail("!locations",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/LocalGraph.cpp"
                ,0x285,"void wasm::LazyLocalGraph::makeFlower() const");
}

Assistant:

void LazyLocalGraph::makeFlower() const {
  // |locations| is set here and filled in by |flower|.
  assert(!locations);
  locations.emplace();

  flower = std::make_unique<LocalGraphFlower>(
    getSetsMap, *locations, func, module, queryClass);

  flower->prepareLaziness();

#ifdef LOCAL_GRAPH_DEBUG
  std::cout << "LazyLocalGraph::dump\n";
  for (auto& [get, sets] : getSetsMap) {
    std::cout << "GET\n" << get << " is influenced by\n";
    for (auto* set : sets) {
      std::cout << set << '\n';
    }
  }
  std::cout << "total locations: " << locations.size() << '\n';
#endif
}